

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# joypad.c
# Opt level: O0

JoypadStateIter joypad_find_state(JoypadBuffer *buffer,Ticks ticks)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  JoypadStateIter JVar4;
  JoypadState *pJVar5;
  JoypadState *mid_;
  JoypadState *end_;
  JoypadState *begin_;
  JoypadState *lower_bound;
  JoypadState *end;
  JoypadState *begin;
  JoypadChunk *chunk_1;
  JoypadChunk *chunk;
  Ticks last_ticks;
  Ticks first_ticks;
  JoypadChunk *last_chunk;
  JoypadChunk *first_chunk;
  Ticks ticks_local;
  JoypadBuffer *buffer_local;
  JoypadStateIter result;
  
  chunk_1 = (buffer->sentinel).next;
  begin = (JoypadState *)(buffer->sentinel).prev;
  if (((((JoypadBuffer *)chunk_1)->sentinel).size == 0) ||
     ((((JoypadBuffer *)begin)->sentinel).size == 0)) {
    __assert_fail("first_chunk->size != 0 && last_chunk->size != 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c",
                  0x65,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
  }
  uVar1 = ((((JoypadBuffer *)chunk_1)->sentinel).data)->ticks;
  uVar2 = (((JoypadBuffer *)begin)->sentinel).data[(((JoypadBuffer *)begin)->sentinel).size - 1].
          ticks;
  if (uVar1 < ticks) {
    if (ticks < uVar2) {
      if (ticks - uVar1 < uVar2 - ticks) {
        while (chunk_1->data[chunk_1->size - 1].ticks <= ticks) {
          chunk_1 = chunk_1->next;
        }
        buffer_local = (JoypadBuffer *)chunk_1;
      }
      else {
        for (; ticks < *(ulong *)begin->ticks; begin = (JoypadState *)begin[2].ticks) {
        }
        buffer_local = (JoypadBuffer *)begin;
      }
      pJVar5 = (buffer_local->sentinel).data;
      begin_ = (JoypadState *)0x0;
      mid_ = pJVar5 + (buffer_local->sentinel).size;
      if ((long)(pJVar5 + (buffer_local->sentinel).size) - (long)pJVar5 >> 4 != 0) {
        while ((end_ = pJVar5, pJVar5 = end_, 1 < (long)mid_ - (long)end_ >> 4 &&
               (auVar3._8_8_ = (long)mid_ - (long)end_ >> 0x3f,
               auVar3._0_8_ = (long)mid_ - (long)end_ >> 4,
               pJVar5 = end_ + SUB168(auVar3 / SEXT816(2),0), ticks != pJVar5->ticks))) {
          if (ticks < pJVar5->ticks) {
            mid_ = pJVar5;
            pJVar5 = end_;
          }
        }
        end_ = pJVar5;
        begin_ = end_;
      }
      if (begin_ == (JoypadState *)0x0) {
        __assert_fail("lower_bound != NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                      ,0x85,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
      }
      result.chunk = (JoypadChunk *)begin_;
      if (ticks < begin_->ticks) {
        __assert_fail("result.state->ticks <= ticks",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/src/joypad.c"
                      ,0x88,"JoypadStateIter joypad_find_state(JoypadBuffer *, Ticks)");
      }
    }
    else {
      result.chunk = (JoypadChunk *)
                     ((((JoypadBuffer *)begin)->sentinel).data +
                     ((((JoypadBuffer *)begin)->sentinel).size - 1));
      buffer_local = (JoypadBuffer *)begin;
    }
  }
  else {
    result.chunk = (JoypadChunk *)(((JoypadBuffer *)chunk_1)->sentinel).data;
    buffer_local = (JoypadBuffer *)chunk_1;
  }
  JVar4.state = (JoypadState *)result.chunk;
  JVar4.chunk = &buffer_local->sentinel;
  return JVar4;
}

Assistant:

JoypadStateIter joypad_find_state(JoypadBuffer* buffer, Ticks ticks) {
  /* TODO(binji): Use a skip list if this is too slow? */
  JoypadStateIter result;
  JoypadChunk* first_chunk = buffer->sentinel.next;
  JoypadChunk* last_chunk = buffer->sentinel.prev;
  assert(first_chunk->size != 0 && last_chunk->size != 0);
  Ticks first_ticks = first_chunk->data[0].ticks;
  Ticks last_ticks = last_chunk->data[last_chunk->size - 1].ticks;
  if (ticks <= first_ticks) {
    /* At or past the beginning. */
    result.chunk = first_chunk;
    result.state = &first_chunk->data[0];
    return result;
  } else if (ticks >= last_ticks) {
    /* At or past the end. */
    result.chunk = last_chunk;
    result.state = &last_chunk->data[last_chunk->size - 1];
    return result;
  } else if (ticks - first_ticks < last_ticks - ticks) {
    /* Closer to the beginning. */
    JoypadChunk* chunk = first_chunk;
    while (ticks >= chunk->data[chunk->size - 1].ticks) {
      chunk = chunk->next;
    }
    result.chunk = chunk;
  } else {
    /* Closer to the end. */
    JoypadChunk* chunk = last_chunk;
    while (ticks < chunk->data[0].ticks) {
      chunk = chunk->prev;
    }
    result.chunk = chunk;
  }

  JoypadState* begin = result.chunk->data;
  JoypadState* end = begin + result.chunk->size;
  LOWER_BOUND(JoypadState, lower_bound, begin, end, ticks, GET_TICKS, CMP_LT);
  assert(lower_bound != NULL); /* The chunk should not be empty. */

  result.state = lower_bound;
  assert(result.state->ticks <= ticks);
  return result;
}